

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ph.h
# Opt level: O3

void duckdb_je_hpdata_age_heap_insert(hpdata_age_heap_t *ph,hpdata_t *phn)

{
  hpdata_t *phVar1;
  hpdata_t *phVar2;
  hpdata_t *phVar3;
  long lVar4;
  uint64_t a_age;
  ulong uVar5;
  uint uVar6;
  hpdata_t *phVar7;
  uint64_t a_age_1;
  bool bVar8;
  
  (phn->field_13).age_link.link.prev = (void *)0x0;
  (phn->field_13).age_link.link.next = (void *)0x0;
  (phn->field_13).age_link.link.lchild = (void *)0x0;
  phVar1 = (hpdata_t *)(ph->ph).root;
  if (phVar1 == (hpdata_t *)0x0) {
    (ph->ph).root = phn;
    return;
  }
  if (phn->h_age < phVar1->h_age) {
    (phn->field_13).age_link.link.lchild = phVar1;
    (phVar1->field_13).ql_link_empty.qre_next = phn;
    (ph->ph).root = phn;
    (ph->ph).auxcount = 0;
    return;
  }
  phVar7 = (phVar1->field_13).ql_link_empty.qre_prev;
  (phn->field_13).ql_link_empty.qre_prev = phVar7;
  if (phVar7 != (hpdata_t *)0x0) {
    (phVar7->field_13).ql_link_empty.qre_next = phn;
  }
  (phn->field_13).ql_link_empty.qre_next = phVar1;
  (phVar1->field_13).ql_link_empty.qre_prev = phn;
  uVar5 = (ph->ph).auxcount + 1;
  (ph->ph).auxcount = uVar5;
  lVar4 = 0;
  if (uVar5 != 0) {
    for (; (uVar5 >> lVar4 & 1) == 0; lVar4 = lVar4 + 1) {
    }
  }
  if (lVar4 != 0) {
    uVar6 = 1;
    while (phVar7 = (phn->field_13).ql_link_empty.qre_prev, phVar7 != (hpdata_t *)0x0) {
      phVar2 = (phVar7->field_13).ql_link_empty.qre_prev;
      (phn->field_13).age_link.link.prev = (void *)0x0;
      (phn->field_13).age_link.link.next = (void *)0x0;
      (phVar7->field_13).age_link.link.prev = (void *)0x0;
      (phVar7->field_13).age_link.link.next = (void *)0x0;
      if (phn->h_age < phVar7->h_age) {
        (phVar7->field_13).ql_link_empty.qre_next = phn;
        phVar3 = (hpdata_t *)(phn->field_13).age_link.link.lchild;
        (phVar7->field_13).ql_link_empty.qre_prev = phVar3;
        if (phVar3 != (hpdata_t *)0x0) {
          (phVar3->field_13).ql_link_empty.qre_next = phVar7;
        }
        (phn->field_13).age_link.link.lchild = phVar7;
        phVar7 = phn;
      }
      else {
        (phn->field_13).ql_link_empty.qre_next = phVar7;
        phVar3 = (hpdata_t *)(phVar7->field_13).age_link.link.lchild;
        (phn->field_13).ql_link_empty.qre_prev = phVar3;
        if (phVar3 != (hpdata_t *)0x0) {
          (phVar3->field_13).ql_link_empty.qre_next = phn;
        }
        (phVar7->field_13).age_link.link.lchild = phn;
      }
      (phVar7->field_13).ql_link_empty.qre_prev = phVar2;
      if (phVar2 == (hpdata_t *)0x0) {
        (phVar1->field_13).ql_link_empty.qre_prev = phVar7;
        (phVar7->field_13).ql_link_empty.qre_next = phVar1;
        return;
      }
      (phVar2->field_13).ql_link_empty.qre_next = phVar7;
      (phVar1->field_13).ql_link_empty.qre_prev = phVar7;
      (phVar7->field_13).ql_link_empty.qre_next = phVar1;
      if (phVar2 == (hpdata_t *)0x0) {
        return;
      }
      bVar8 = (uint)lVar4 <= uVar6;
      phn = phVar7;
      uVar6 = uVar6 + 1;
      if (bVar8) {
        return;
      }
    }
  }
  return;
}

Assistant:

JEMALLOC_ALWAYS_INLINE void
phn_link_init(void *phn, size_t offset) {
	phn_link_get(phn, offset)->prev = NULL;
	phn_link_get(phn, offset)->next = NULL;
	phn_link_get(phn, offset)->lchild = NULL;
}